

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

string * __thiscall
MipsOpcodeFormatter::formatOpcode_abi_cxx11_
          (MipsOpcodeFormatter *this,MipsOpcodeData *opData,MipsRegisterData *regData,
          MipsImmediateData *immData)

{
  ulong uVar1;
  MipsImmediateData *immData_local;
  MipsRegisterData *regData_local;
  MipsOpcodeData *opData_local;
  MipsOpcodeFormatter *this_local;
  
  std::__cxx11::string::operator=((string *)this,"   ");
  handleOpcodeName(this,opData);
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (10 < uVar1) break;
    std::__cxx11::string::operator+=((string *)this,' ');
  }
  handleOpcodeParameters(this,opData,regData,immData);
  return &this->buffer;
}

Assistant:

const std::string& MipsOpcodeFormatter::formatOpcode(const MipsOpcodeData& opData, const MipsRegisterData& regData,
	const MipsImmediateData& immData)
{
	buffer = "   ";
	handleOpcodeName(opData);

	while (buffer.size() < 11)
		buffer += ' ';

	handleOpcodeParameters(opData,regData,immData);
	return buffer;
}